

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_f33f06::HandleRandomCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  pointer pcVar2;
  undefined1 *puVar3;
  long lVar4;
  int iVar5;
  size_t sVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  string_view value;
  vector<char,_std::allocator<char>_> result;
  string alphabet;
  char cmStringCommandDefaultAlphabet [63];
  uint local_d0;
  char local_c9;
  vector<char,_std::allocator<char>_> local_c8;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  double local_88;
  double dStack_80;
  long *local_78;
  char acStack_70 [8];
  long local_68;
  char acStack_60 [48];
  
  uVar10 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5;
  if ((uVar10 < 6) && ((0x2bUL >> (uVar10 & 0x3f) & 1) != 0)) {
    local_78 = &local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"sub-command RANDOM requires at least one argument.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    return false;
  }
  builtin_strncpy(acStack_60 + 8,"UIOPASDFGHJKLZXCVBNM0123456789",0x1f);
  local_68._0_1_ = 'j';
  local_68._1_1_ = 'k';
  local_68._2_1_ = 'l';
  local_68._3_1_ = 'z';
  local_68._4_1_ = 'x';
  local_68._5_1_ = 'c';
  local_68._6_1_ = 'v';
  local_68._7_1_ = 'b';
  builtin_strncpy(acStack_60,"nmQWERTY",8);
  local_78 = (long *)0x6975797472657771;
  builtin_strncpy(acStack_70,"opasdfgh",8);
  local_a8 = &local_98;
  local_a0 = 0;
  local_98 = 0;
  local_d0 = 0;
  iVar5 = 5;
  if (uVar10 < 4) {
    bVar7 = false;
  }
  else {
    local_d0 = 0;
    bVar7 = false;
    if (1 < uVar10 - 2) {
      local_88 = (double)CONCAT44(local_88._4_4_,5);
      uVar9 = 1;
      bVar7 = false;
      local_d0 = 0;
      do {
        iVar5 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar9));
        if (iVar5 == 0) {
          uVar9 = uVar9 + 1;
          iVar5 = atoi((args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p);
          local_88 = (double)CONCAT44(local_88._4_4_,iVar5);
        }
        else {
          iVar5 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar9));
          if (iVar5 == 0) {
            uVar9 = uVar9 + 1;
            std::__cxx11::string::_M_assign((string *)&local_a8);
          }
          else {
            iVar5 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar9));
            if (iVar5 == 0) {
              uVar9 = uVar9 + 1;
              local_d0 = atoi((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p);
              bVar7 = true;
            }
          }
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < uVar10 - 2);
      iVar5 = local_88._0_4_;
    }
  }
  if (local_a0 == 0) {
    strlen((char *)&local_78);
    std::__cxx11::string::_M_replace((ulong)&local_a8,0,(char *)0x0,(ulong)&local_78);
  }
  lVar4 = local_a0;
  if (local_a0 == 0) {
    local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"sub-command RANDOM invoked with bad alphabet.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    if (0 < iVar5) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (char *)0x0;
      local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (char *)0x0;
      if ((~(anonymous_namespace)::
            HandleRandomCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
            ::seeded & 1) != 0 || bVar7) {
        (anonymous_namespace)::
        HandleRandomCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::seeded = 1;
        if (!bVar7) {
          local_d0 = cmSystemTools::RandomSeed();
        }
        srand(local_d0);
      }
      puVar3 = local_a8;
      auVar11._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar11._0_8_ = lVar4;
      auVar11._12_4_ = 0x45300000;
      dStack_80 = auVar11._8_8_ - 1.9342813113834067e+25;
      local_88 = dStack_80 + ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
      iVar8 = 1;
      if (1 < iVar5) {
        iVar8 = iVar5;
      }
      do {
        iVar5 = rand();
        if (local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish ==
            local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)&local_c8,
                     (iterator)
                     local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     puVar3 + (int)((double)iVar5 * local_88 * 4.656612873077393e-10));
        }
        else {
          *local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_finish = puVar3[(int)((double)iVar5 * local_88 * 4.656612873077393e-10)];
          local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      local_c9 = '\0';
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(&local_c8,&local_c9);
      pcVar2 = local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      this = status->Makefile;
      sVar6 = strlen(local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
      value._M_str = pcVar2;
      value._M_len = sVar6;
      cmMakefile::AddDefinition(this,pbVar1 + -1,value);
      if ((pointer *)
          local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer *)0x0) {
        operator_delete(local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      bVar7 = true;
      goto LAB_0033174a;
    }
    local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"sub-command RANDOM invoked with bad length.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  if ((pointer *)
      local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1));
  }
  bVar7 = false;
LAB_0033174a:
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
  }
  return bVar7;
}

Assistant:

bool HandleRandomCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.size() < 2 || args.size() == 3 || args.size() == 5) {
    status.SetError("sub-command RANDOM requires at least one argument.");
    return false;
  }

  static bool seeded = false;
  bool force_seed = false;
  unsigned int seed = 0;
  int length = 5;
  const char cmStringCommandDefaultAlphabet[] = "qwertyuiopasdfghjklzxcvbnm"
                                                "QWERTYUIOPASDFGHJKLZXCVBNM"
                                                "0123456789";
  std::string alphabet;

  if (args.size() > 3) {
    size_t i = 1;
    size_t stopAt = args.size() - 2;

    for (; i < stopAt; ++i) {
      if (args[i] == "LENGTH") {
        ++i;
        length = atoi(args[i].c_str());
      } else if (args[i] == "ALPHABET") {
        ++i;
        alphabet = args[i];
      } else if (args[i] == "RANDOM_SEED") {
        ++i;
        seed = static_cast<unsigned int>(atoi(args[i].c_str()));
        force_seed = true;
      }
    }
  }
  if (alphabet.empty()) {
    alphabet = cmStringCommandDefaultAlphabet;
  }

  double sizeofAlphabet = static_cast<double>(alphabet.size());
  if (sizeofAlphabet < 1) {
    status.SetError("sub-command RANDOM invoked with bad alphabet.");
    return false;
  }
  if (length < 1) {
    status.SetError("sub-command RANDOM invoked with bad length.");
    return false;
  }
  const std::string& variableName = args.back();

  std::vector<char> result;

  if (!seeded || force_seed) {
    seeded = true;
    srand(force_seed ? seed : cmSystemTools::RandomSeed());
  }

  const char* alphaPtr = alphabet.c_str();
  for (int cc = 0; cc < length; cc++) {
    int idx = static_cast<int>(sizeofAlphabet * rand() / (RAND_MAX + 1.0));
    result.push_back(*(alphaPtr + idx));
  }
  result.push_back(0);

  status.GetMakefile().AddDefinition(variableName, result.data());
  return true;
}